

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O2

double __thiscall S2Cell::ApproxArea(S2Cell *this)

{
  double dVar1;
  FloatType FVar2;
  double dVar3;
  double local_98;
  double dStack_90;
  double local_88;
  S2Point local_78;
  S2Point local_60;
  S2Point local_48;
  S2Point local_30;
  
  if (this->level_ < 2) {
    dVar1 = AverageArea((int)this->level_);
    return dVar1;
  }
  GetVertex(&local_30,this,2);
  GetVertex(&local_48,this,0);
  GetVertex(&local_60,this,3);
  GetVertex(&local_78,this,1);
  local_98 = (local_30.c_[1] - local_48.c_[1]) * (local_60.c_[2] - local_78.c_[2]) -
             (local_60.c_[1] - local_78.c_[1]) * (local_30.c_[2] - local_48.c_[2]);
  dStack_90 = (local_30.c_[2] - local_48.c_[2]) * (local_60.c_[0] - local_78.c_[0]) -
              (local_60.c_[2] - local_78.c_[2]) * (local_30.c_[0] - local_48.c_[0]);
  local_88 = (local_30.c_[0] - local_48.c_[0]) * (local_60.c_[1] - local_78.c_[1]) -
             (local_60.c_[0] - local_78.c_[0]) * (local_30.c_[1] - local_48.c_[1]);
  FVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&local_98);
  dVar3 = FVar2 * 0.5;
  dVar1 = 1.0;
  if (dVar3 * 0.3183098861837907 <= 1.0) {
    dVar1 = dVar3 * 0.3183098861837907;
  }
  dVar1 = 1.0 - dVar1;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  return (dVar3 + dVar3) / (dVar1 + 1.0);
}

Assistant:

double S2Cell::ApproxArea() const {
  // All cells at the first two levels have the same area.
  if (level_ < 2) return AverageArea(level_);

  // First, compute the approximate area of the cell when projected
  // perpendicular to its normal.  The cross product of its diagonals gives
  // the normal, and the length of the normal is twice the projected area.
  double flat_area = 0.5 * (GetVertex(2) - GetVertex(0)).
                     CrossProd(GetVertex(3) - GetVertex(1)).Norm();

  // Now, compensate for the curvature of the cell surface by pretending
  // that the cell is shaped like a spherical cap.  The ratio of the
  // area of a spherical cap to the area of its projected disc turns out
  // to be 2 / (1 + sqrt(1 - r*r)) where "r" is the radius of the disc.
  // For example, when r=0 the ratio is 1, and when r=1 the ratio is 2.
  // Here we set Pi*r*r == flat_area to find the equivalent disc.
  return flat_area * 2 / (1 + sqrt(1 - min(M_1_PI * flat_area, 1.0)));
}